

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O0

LanguageBreakEngine * __thiscall
icu_63::RuleBasedBreakIterator::getLanguageBreakEngine(RuleBasedBreakIterator *this,UChar32 c)

{
  UBool UVar1;
  int iVar2;
  UStack *this_00;
  UnhandledEngine *this_01;
  undefined4 in_register_00000034;
  UErrorCode *status_00;
  UnhandledEngine *local_88;
  UStack *local_70;
  int local_50;
  int32_t i;
  UErrorCode local_2c;
  LanguageBreakEngine *pLStack_28;
  UErrorCode status;
  LanguageBreakEngine *lbe;
  RuleBasedBreakIterator *pRStack_18;
  UChar32 c_local;
  RuleBasedBreakIterator *this_local;
  
  status_00 = (UErrorCode *)CONCAT44(in_register_00000034,c);
  pLStack_28 = (LanguageBreakEngine *)0x0;
  local_2c = U_ZERO_ERROR;
  lbe._4_4_ = c;
  pRStack_18 = this;
  if (this->fLanguageBreakEngines == (UStack *)0x0) {
    this_00 = (UStack *)UMemory::operator_new((UMemory *)0x28,(size_t)status_00);
    local_70 = (UStack *)0x0;
    if (this_00 != (UStack *)0x0) {
      status_00 = &local_2c;
      UStack::UStack(this_00,status_00);
      local_70 = this_00;
    }
    this->fLanguageBreakEngines = local_70;
    if ((this->fLanguageBreakEngines == (UStack *)0x0) ||
       (UVar1 = ::U_FAILURE(local_2c), UVar1 != '\0')) {
      if (this->fLanguageBreakEngines != (UStack *)0x0) {
        (*(this->fLanguageBreakEngines->super_UVector).super_UObject._vptr_UObject[1])();
      }
      this->fLanguageBreakEngines = (UStack *)0x0;
      return (LanguageBreakEngine *)0x0;
    }
  }
  local_50 = UVector::size(&this->fLanguageBreakEngines->super_UVector);
  while (local_50 = local_50 + -1, -1 < local_50) {
    pLStack_28 = (LanguageBreakEngine *)
                 UVector::elementAt(&this->fLanguageBreakEngines->super_UVector,local_50);
    status_00 = (UErrorCode *)(ulong)lbe._4_4_;
    iVar2 = (*pLStack_28->_vptr_LanguageBreakEngine[2])();
    if ((char)iVar2 != '\0') {
      return pLStack_28;
    }
  }
  pLStack_28 = getLanguageBreakEngineFromFactory(lbe._4_4_);
  if (pLStack_28 != (LanguageBreakEngine *)0x0) {
    UStack::push(this->fLanguageBreakEngines,pLStack_28,&local_2c);
    return pLStack_28;
  }
  if (this->fUnhandledBreakEngine == (UnhandledEngine *)0x0) {
    this_01 = (UnhandledEngine *)UMemory::operator_new((UMemory *)0x10,(size_t)status_00);
    local_88 = (UnhandledEngine *)0x0;
    if (this_01 != (UnhandledEngine *)0x0) {
      UnhandledEngine::UnhandledEngine(this_01,&local_2c);
      local_88 = this_01;
    }
    this->fUnhandledBreakEngine = local_88;
    UVar1 = ::U_SUCCESS(local_2c);
    if ((UVar1 != '\0') && (this->fUnhandledBreakEngine == (UnhandledEngine *)0x0)) {
      return (LanguageBreakEngine *)0x0;
    }
    UVector::insertElementAt
              (&this->fLanguageBreakEngines->super_UVector,this->fUnhandledBreakEngine,0,&local_2c);
    UVar1 = ::U_FAILURE(local_2c);
    if (UVar1 != '\0') {
      if (this->fUnhandledBreakEngine != (UnhandledEngine *)0x0) {
        (*(this->fUnhandledBreakEngine->super_LanguageBreakEngine)._vptr_LanguageBreakEngine[1])();
      }
      this->fUnhandledBreakEngine = (UnhandledEngine *)0x0;
      return (LanguageBreakEngine *)0x0;
    }
  }
  (*(this->fUnhandledBreakEngine->super_LanguageBreakEngine)._vptr_LanguageBreakEngine[4])
            (this->fUnhandledBreakEngine,(ulong)lbe._4_4_);
  return &this->fUnhandledBreakEngine->super_LanguageBreakEngine;
}

Assistant:

const LanguageBreakEngine *
RuleBasedBreakIterator::getLanguageBreakEngine(UChar32 c) {
    const LanguageBreakEngine *lbe = NULL;
    UErrorCode status = U_ZERO_ERROR;

    if (fLanguageBreakEngines == NULL) {
        fLanguageBreakEngines = new UStack(status);
        if (fLanguageBreakEngines == NULL || U_FAILURE(status)) {
            delete fLanguageBreakEngines;
            fLanguageBreakEngines = 0;
            return NULL;
        }
    }

    int32_t i = fLanguageBreakEngines->size();
    while (--i >= 0) {
        lbe = (const LanguageBreakEngine *)(fLanguageBreakEngines->elementAt(i));
        if (lbe->handles(c)) {
            return lbe;
        }
    }

    // No existing dictionary took the character. See if a factory wants to
    // give us a new LanguageBreakEngine for this character.
    lbe = getLanguageBreakEngineFromFactory(c);

    // If we got one, use it and push it on our stack.
    if (lbe != NULL) {
        fLanguageBreakEngines->push((void *)lbe, status);
        // Even if we can't remember it, we can keep looking it up, so
        // return it even if the push fails.
        return lbe;
    }

    // No engine is forthcoming for this character. Add it to the
    // reject set. Create the reject break engine if needed.
    if (fUnhandledBreakEngine == NULL) {
        fUnhandledBreakEngine = new UnhandledEngine(status);
        if (U_SUCCESS(status) && fUnhandledBreakEngine == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return nullptr;
        }
        // Put it last so that scripts for which we have an engine get tried
        // first.
        fLanguageBreakEngines->insertElementAt(fUnhandledBreakEngine, 0, status);
        // If we can't insert it, or creation failed, get rid of it
        if (U_FAILURE(status)) {
            delete fUnhandledBreakEngine;
            fUnhandledBreakEngine = 0;
            return NULL;
        }
    }

    // Tell the reject engine about the character; at its discretion, it may
    // add more than just the one character.
    fUnhandledBreakEngine->handleCharacter(c);

    return fUnhandledBreakEngine;
}